

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tunings.h
# Opt level: O3

void __thiscall Tunings::TuningError::~TuningError(TuningError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__TuningError_00109d90;
  pcVar2 = (this->whatv)._M_dataplus._M_p;
  paVar1 = &(this->whatv).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

TuningError(std::string m) : whatv(m) {}